

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void pobr::utils::Logger::debugFatal(string *message)

{
  Exception *this;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,"Fatal",&local_52);
  std::__cxx11::string::string((string *)&local_30,"magenta",&local_51);
  TerminalPrinter::printLabel(&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"Fatal",&local_52);
  local_30._M_dataplus._M_p._0_4_ = TerminalPrinter::getLabelLength(&local_50);
  print((uint *)&local_30,message);
  std::__cxx11::string::~string((string *)&local_50);
  this = (Exception *)__cxa_allocate_exception(0x28);
  Exception::Exception(this,message);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Logger::debugFatal(const std::string& message)
{
    Logger::printLabel("Fatal", "magenta");
    Logger::print(Logger::getLabelLength("Fatal"), message);

    throw Logger::Exception(message);
}